

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tflags.h
# Opt level: O3

void __thiscall AActor::Crash(AActor *this)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  FState *newstate;
  FName labels [3];
  FName local_30;
  FName local_2c;
  FName local_28;
  FName local_24;
  FName local_20;
  undefined8 local_1c;
  int local_14;
  PClassActor *this_00;
  
  uVar2 = (this->flags6).Value;
  if ((uVar2 >> 0x19 & 1) != 0) {
    return;
  }
  uVar3 = (this->flags).Value;
  if ((uVar2 & 0x40000) == 0 && (uVar3 & 0x100000) == 0) {
    return;
  }
  if ((int)uVar3 < 0) {
    return;
  }
  if (((this->flags3).Value & 0x200000) != 0) {
    return;
  }
  if ((this->DamageType).super_FName.Index == 0) {
LAB_00423a30:
    iVar5 = this->health;
    iVar4 = GetGibHealth(this);
    if (iVar5 < iVar4) {
      local_28.Index = 0x8b;
      local_2c.Index = 0xce;
      newstate = FindState(this,&local_28,&local_2c,false);
    }
    else {
      local_30.Index = 0x8b;
      newstate = FindState(this,&local_30);
    }
    if (newstate == (FState *)0x0) goto LAB_00423a89;
  }
  else {
    iVar5 = this->health;
    iVar4 = GetGibHealth(this);
    if (iVar5 < iVar4) {
      local_1c = 0xce0000008b;
      local_14 = (this->DamageType).super_FName.Index;
      this_00 = (PClassActor *)(this->super_DThinker).super_DObject.Class;
      if (this_00 == (PClassActor *)0x0) {
        iVar5 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
        this_00 = (PClassActor *)CONCAT44(extraout_var,iVar5);
        (this->super_DThinker).super_DObject.Class = (PClass *)this_00;
      }
      newstate = PClassActor::FindState(this_00,3,(FName *)&local_1c,true);
      if (newstate == (FState *)0x0) goto LAB_00423a06;
    }
    else {
LAB_00423a06:
      local_20.Index = 0x8b;
      local_24.Index = (this->DamageType).super_FName.Index;
      newstate = FindState(this,&local_20,&local_24,true);
      if (newstate == (FState *)0x0) goto LAB_00423a30;
    }
  }
  SetState(this,newstate,false);
LAB_00423a89:
  pbVar1 = (byte *)((long)&(this->flags3).Value + 2);
  *pbVar1 = *pbVar1 | 0x20;
  return;
}

Assistant:

Self operator& (T value) const { return Self::FromInt (Value & value); }